

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  long *plVar4;
  ostream *poVar5;
  size_t sVar6;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var7;
  long *plVar8;
  size_type *psVar9;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var10;
  uint uVar11;
  char flag;
  Message error;
  char buffer [256];
  byte local_221;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  int local_1dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  Message local_1b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b0;
  long local_1a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  string local_158;
  string local_138 [8];
  
  do {
    sVar2 = read(this->read_fd_,&local_221,1);
    iVar1 = (int)sVar2;
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        this->outcome_ = DIED;
        goto LAB_001258d2;
      }
      if (iVar1 == 1) {
        if (local_221 < 0x52) {
          if (local_221 == 0x49) {
            iVar1 = this->read_fd_;
            Message::Message(&local_1b8);
            do {
              while( true ) {
                sVar2 = read(iVar1,local_138,0xff);
                uVar11 = (uint)sVar2;
                if ((int)uVar11 < 1) break;
                *(undefined1 *)((long)&local_138[0]._M_dataplus._M_p + (ulong)(uVar11 & 0x7fffffff))
                     = 0;
                sVar6 = strlen((char *)local_138);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)
                           ((long)local_1b8.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 0x10),(char *)local_138,sVar6);
              }
            } while ((uVar11 == 0xffffffff) && (piVar3 = __errno_location(), *piVar3 == 4));
            if (uVar11 == 0) {
              GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest-death-test.cc"
                                 ,0x16f);
              StringStreamToString
                        (&local_220,
                         (stringstream *)
                         local_1b8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length
                        );
            }
            else {
              piVar3 = __errno_location();
              iVar1 = *piVar3;
              GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest-death-test.cc"
                                 ,0x172);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
              GetLastErrnoDescription_abi_cxx11_();
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_220._M_dataplus._M_p,
                                  local_220._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," [",2);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            GTestLog::~GTestLog((GTestLog *)&local_200);
            if (local_1b8.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
                (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                 )0x0) {
              (**(code **)(*(long *)local_1b8.ss_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl + 8))
                        (local_1b8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
            }
            goto LAB_001258d2;
          }
          if (local_221 == 0x4c) {
            this->outcome_ = LIVED;
            goto LAB_001258d2;
          }
        }
        else {
          if (local_221 == 0x54) {
            this->outcome_ = THREW;
            goto LAB_001258d2;
          }
          if (local_221 == 0x52) {
            this->outcome_ = RETURNED;
            goto LAB_001258d2;
          }
        }
        GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest-death-test.cc"
                           ,499);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Death test child process reported ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unexpected status byte (",0x18);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        GTestLog::~GTestLog((GTestLog *)local_138);
        goto LAB_001258d2;
      }
      break;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  GTestLog::GTestLog((GTestLog *)&local_220,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/ThirdParty/googletest/googletest/src/gtest-death-test.cc"
                     ,0x1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_138[0]._M_dataplus._M_p,local_138[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_220);
LAB_001258d2:
  do {
    iVar1 = close(this->read_fd_);
    if (iVar1 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"CHECK failed: File ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_178);
  local_198 = (long *)*plVar4;
  plVar8 = plVar4 + 2;
  if (local_198 == plVar8) {
    local_188 = *plVar8;
    lStack_180 = plVar4[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *plVar8;
  }
  local_190 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
  local_1d8._M_dataplus._M_p = (pointer)*plVar4;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_1d8._M_dataplus._M_p == psVar9) {
    local_1d8.field_2._M_allocated_capacity = *psVar9;
    local_1d8.field_2._8_8_ = plVar4[3];
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar9;
  }
  local_1d8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1dc = 0x1fb;
  StreamableToString<int>(&local_158,&local_1dc);
  std::operator+(&local_200,&local_1d8,&local_158);
  p_Var7 = (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::__cxx11::string::append((char *)&local_200);
  local_1b8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       *(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&p_Var7->_M_t;
  _Var10._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(p_Var7 + 2);
  if (local_1b8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl ==
      (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )_Var10._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl) {
    local_1a8 = *(long *)_Var10._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    _Stack_1a0._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
          &p_Var7[3]._M_t;
    local_1b8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )&local_1a8;
  }
  else {
    local_1a8 = *(long *)_Var10._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
  }
  local_1b0._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)&p_Var7[1]._M_t;
  p_Var7->_M_t = _Var10._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
  p_Var7[1]._M_t =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  *(undefined1 *)&p_Var7[2]._M_t = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  local_220._M_dataplus._M_p = (pointer)*plVar4;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_220._M_dataplus._M_p == psVar9) {
    local_220.field_2._M_allocated_capacity = *psVar9;
    local_220.field_2._8_8_ = plVar4[3];
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar9;
  }
  local_220._M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_220);
  local_138[0]._M_dataplus._M_p = (pointer)*plVar4;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_138[0]._M_dataplus._M_p == psVar9) {
    local_138[0].field_2._0_8_ = *psVar9;
    local_138[0].field_2._8_8_ = plVar4[3];
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  }
  else {
    local_138[0].field_2._0_8_ = *psVar9;
  }
  local_138[0]._M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  DeathTestAbort(local_138);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}